

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O0

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1344:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  std_fenced_block local_7d [8];
  fenced_block b;
  undefined1 local_70 [8];
  anon_class_32_2_788f4206_for_handler_ handler;
  undefined1 auStack_48 [7];
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1344:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
  w;
  ptr p;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1344:26),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *h;
  size_t param_3_local;
  error_code *param_2_local;
  operation *base_local;
  void *owner_local;
  
  _auStack_48 = (anon_class_32_2_788f4206_for_handler_ *)(base + 1);
  fineftp::FtpSession::endDataReceiving(std::shared_ptr<fineftp::FtpSession::IoFile>)::$_0::__0
            ((__0 *)local_70,(anon_class_32_2_788f4206_for_handler_ *)(base + 1));
  _auStack_48 = (anon_class_32_2_788f4206_for_handler_ *)local_70;
  ptr::reset((ptr *)auStack_48);
  if (owner != (void *)0x0) {
    std_fenced_block::std_fenced_block(local_7d,half);
    handler_work<fineftp::FtpSession::endDataReceiving(std::shared_ptr<fineftp::FtpSession::IoFile>)::$_0,asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>
    ::
    complete<fineftp::FtpSession::endDataReceiving(std::shared_ptr<fineftp::FtpSession::IoFile>)::__0>
              ((handler_work<fineftp::FtpSession::endDataReceiving(std::shared_ptr<fineftp::FtpSession::IoFile>)::__0,asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>
                *)((long)&handler.file.
                          super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + 7),(anon_class_32_2_788f4206_for_handler_ *)local_70,
               (anon_class_32_2_788f4206_for_handler_ *)local_70);
    std_fenced_block::~std_fenced_block(local_7d);
  }
  fineftp::FtpSession::endDataReceiving(std::shared_ptr<fineftp::FtpSession::IoFile>)::$_0::~__0
            ((__0 *)local_70);
  ptr::~ptr((ptr *)auStack_48);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }